

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CacheOperators.cpp
# Opt level: O0

void Js::CacheOperators::CachePropertyRead
               (Var startingObject,RecyclableObject *objectWithProperty,bool isRoot,
               PropertyId propertyId,bool isMissing,PropertyValueInfo *info,
               ScriptContext *requestContext)

{
  code *pcVar1;
  DynamicObject *objectWithProperty_00;
  PropertyIndex PVar2;
  bool bVar3;
  InlineCacheFlags IVar4;
  bool bVar5;
  PropertyIndex PVar6;
  uint uVar7;
  uint uVar8;
  TypeId typeId;
  int iVar9;
  undefined4 *puVar10;
  RecyclableObject *pRVar11;
  RootObjectBase *this;
  DynamicType *this_00;
  DynamicTypeHandler *this_01;
  ScriptContext *pSVar12;
  Type *type;
  bool local_5b;
  PropertyIndex local_5a;
  bool isProto;
  bool isInlineSlot;
  DynamicObject *pDStack_58;
  PropertyIndex slotIndex;
  DynamicObject *dynamicObjectWithProperty;
  PropertyValueInfo *pPStack_48;
  PropertyIndex propertyIndex;
  PropertyValueInfo *info_local;
  uint local_38;
  bool isMissing_local;
  PropertyId propertyId_local;
  bool isRoot_local;
  RecyclableObject *objectWithProperty_local;
  Var startingObject_local;
  
  pPStack_48 = info;
  info_local._7_1_ = isMissing;
  local_38 = propertyId;
  isMissing_local = isRoot;
  _propertyId_local = objectWithProperty;
  objectWithProperty_local = (RecyclableObject *)startingObject;
  bVar3 = CanCachePropertyRead(info,objectWithProperty,requestContext);
  if (!bVar3) {
    return;
  }
  IVar4 = PropertyValueInfo::GetFlags(pPStack_48);
  if ((IVar4 & InlineCacheGetterFlag) != InlineCacheNoFlags) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/CacheOperators.cpp"
                                ,0x1b,"(!(info->GetFlags() & InlineCacheGetterFlag))",
                                "We cache getters only in DictionaryTypeHandler::GetProperty() before they were executed"
                               );
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 0;
  }
  IVar4 = PropertyValueInfo::GetFlags(pPStack_48);
  if ((IVar4 & InlineCacheSetterFlag) != InlineCacheNoFlags) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/CacheOperators.cpp"
                                ,0x1c,"((info->GetFlags() & InlineCacheSetterFlag) == 0)",
                                "invalid setter flag in CachePropertyRead");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 0;
  }
  pRVar11 = PropertyValueInfo::GetInstance(pPStack_48);
  if (pRVar11 != _propertyId_local) {
    bVar3 = PropertyValueInfo::IsNoCache(pPStack_48);
    if (bVar3) {
      return;
    }
    uVar7 = (*(_propertyId_local->super_FinalizableObject).super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[9])(_propertyId_local,(ulong)local_38);
    if ((uVar7 & 0xffff) == 0xffff) {
      return;
    }
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/CacheOperators.cpp"
                                ,0x1f,
                                "(info->IsNoCache() || objectWithProperty->GetPropertyIndex(propertyId) == Constants::NoSlot)"
                                ,"Missed updating PropertyValueInfo?");
    if (bVar3) {
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar10 = 0;
      return;
    }
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  dynamicObjectWithProperty._6_2_ = PropertyValueInfo::GetPropertyIndex(pPStack_48);
  uVar7 = (uint)dynamicObjectWithProperty._6_2_;
  uVar8 = (*(_propertyId_local->super_FinalizableObject).super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[9])(_propertyId_local,(ulong)local_38);
  if (uVar7 != (uVar8 & 0xffff)) {
    bVar3 = VarIs<Js::RootObjectBase,Js::RecyclableObject>(_propertyId_local);
    PVar2 = dynamicObjectWithProperty._6_2_;
    if (bVar3) {
      this = VarTo<Js::RootObjectBase,Js::RecyclableObject>(_propertyId_local);
      PVar6 = RootObjectBase::GetRootPropertyIndex(this,local_38);
      if (PVar2 == PVar6) goto LAB_00d9bc44;
    }
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/CacheOperators.cpp"
                                ,0x26,
                                "(propertyIndex == objectWithProperty->GetPropertyIndex(propertyId) || (VarIs<RootObjectBase>(objectWithProperty) && propertyIndex == VarTo<RootObjectBase>(objectWithProperty)->GetRootPropertyIndex(propertyId)))"
                                ,
                                "propertyIndex == objectWithProperty->GetPropertyIndex(propertyId) || (VarIs<RootObjectBase>(objectWithProperty) && propertyIndex == VarTo<RootObjectBase>(objectWithProperty)->GetRootPropertyIndex(propertyId))"
                               );
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 0;
  }
LAB_00d9bc44:
  typeId = RecyclableObject::GetTypeId(_propertyId_local);
  bVar3 = DynamicType::Is(typeId);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/CacheOperators.cpp"
                                ,0x27,"(DynamicType::Is(objectWithProperty->GetTypeId()))",
                                "DynamicType::Is(objectWithProperty->GetTypeId())");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 0;
  }
  bVar3 = PropertyValueInfo::IsNoCache(pPStack_48);
  if ((((!bVar3) && (bVar3 = PropertyValueInfo::IsStoreFieldCacheEnabled(pPStack_48), bVar3)) &&
      (pRVar11 = PropertyValueInfo::GetInstance(pPStack_48), pRVar11 == _propertyId_local)) &&
     (iVar9 = (*(_propertyId_local->super_FinalizableObject).super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject[0x23])(_propertyId_local,(ulong)local_38), iVar9 != 0))
  {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/CacheOperators.cpp"
                                ,0x2c,
                                "(info->IsNoCache() || !info->IsStoreFieldCacheEnabled() || info->GetInstance() != objectWithProperty || !objectWithProperty->IsFixedProperty(propertyId))"
                                ,
                                "info->IsNoCache() || !info->IsStoreFieldCacheEnabled() || info->GetInstance() != objectWithProperty || !objectWithProperty->IsFixedProperty(propertyId)"
                               );
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 0;
  }
  pDStack_58 = VarTo<Js::DynamicObject,Js::RecyclableObject>(_propertyId_local);
  this_00 = DynamicObject::GetDynamicType(pDStack_58);
  this_01 = DynamicType::GetTypeHandler(this_00);
  DynamicTypeHandler::PropertyIndexToInlineOrAuxSlotIndex
            (this_01,dynamicObjectWithProperty._6_2_,&local_5a,&local_5b);
  bVar3 = _propertyId_local != objectWithProperty_local;
  if (bVar3) {
    bVar5 = PropertyValueInfo::PrototypeCacheDisabled(pPStack_48);
    if (bVar5) {
      return;
    }
    bVar5 = VarIs<Js::RecyclableObject>(objectWithProperty_local);
    if (!bVar5) {
      return;
    }
    pRVar11 = UnsafeVarTo<Js::RecyclableObject>(objectWithProperty_local);
    pSVar12 = RecyclableObject::GetScriptContext(pRVar11);
    if (pSVar12 != requestContext) {
      return;
    }
  }
  else {
    bVar5 = PropertyValueInfo::IsWritable(pPStack_48);
    iVar9 = (*(_propertyId_local->super_FinalizableObject).super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x30])(_propertyId_local,(ulong)local_38);
    if (bVar5 != (iVar9 != 0)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar10 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/CacheOperators.cpp"
                                  ,0x37,
                                  "(info->IsWritable() == (objectWithProperty->IsWritable(propertyId) ? true : false))"
                                  ,
                                  "info->IsWritable() == (objectWithProperty->IsWritable(propertyId) ? true : false)"
                                 );
      if (!bVar5) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar10 = 0;
    }
  }
  bVar5 = isMissing_local;
  objectWithProperty_00 = pDStack_58;
  pRVar11 = VarTo<Js::RecyclableObject>(objectWithProperty_local);
  type = RecyclableObject::GetType(pRVar11);
  Cache<false,true,true>
            (bVar3,objectWithProperty_00,(bool)(bVar5 & 1),type,(Type *)0x0,local_38,local_5a,
             (bool)(local_5b & 1),(bool)(info_local._7_1_ & 1),0,pPStack_48,requestContext);
  return;
}

Assistant:

void CacheOperators::CachePropertyRead(
        Var startingObject,
        RecyclableObject * objectWithProperty,
        const bool isRoot,
        PropertyId propertyId,
        const bool isMissing,
        PropertyValueInfo* info,
        ScriptContext * requestContext)
    {
        if (!CanCachePropertyRead(info, objectWithProperty, requestContext))
        {
            return;
        }

        AssertMsg(!(info->GetFlags() & InlineCacheGetterFlag), "We cache getters only in DictionaryTypeHandler::GetProperty() before they were executed");
        AssertMsg((info->GetFlags() & InlineCacheSetterFlag) == 0, "invalid setter flag in CachePropertyRead");
        if (info->GetInstance() != objectWithProperty) // We can't cache if slot owner is not the object
        {
            AssertMsg(info->IsNoCache() || objectWithProperty->GetPropertyIndex(propertyId) == Constants::NoSlot, "Missed updating PropertyValueInfo?");
            return;
        }

        PropertyIndex propertyIndex = info->GetPropertyIndex();

        Assert(propertyIndex == objectWithProperty->GetPropertyIndex(propertyId) ||
            (VarIs<RootObjectBase>(objectWithProperty) && propertyIndex == VarTo<RootObjectBase>(objectWithProperty)->GetRootPropertyIndex(propertyId)));
        Assert(DynamicType::Is(objectWithProperty->GetTypeId()));

#if ENABLE_FIXED_FIELDS
        // We are populating a cache guarded by the instance's type (not the type of the object with property somewhere in the prototype chain),
        // so we only care if the instance's property (if any) is fixed.
        Assert(info->IsNoCache() || !info->IsStoreFieldCacheEnabled() || info->GetInstance() != objectWithProperty || !objectWithProperty->IsFixedProperty(propertyId));
#endif

        DynamicObject * dynamicObjectWithProperty = VarTo<DynamicObject>(objectWithProperty);
        PropertyIndex slotIndex;
        bool isInlineSlot;
        dynamicObjectWithProperty->GetDynamicType()->GetTypeHandler()->PropertyIndexToInlineOrAuxSlotIndex(propertyIndex, &slotIndex, &isInlineSlot);

        const bool isProto = objectWithProperty != startingObject;
        if(!isProto)
        {
            Assert(info->IsWritable() == (objectWithProperty->IsWritable(propertyId) ? true : false));
            // Because StFld and LdFld caches aren't shared, we can safely cache for LdFld operations even if the property isn't writable.
        }
        else if(
            PropertyValueInfo::PrototypeCacheDisabled((PropertyValueInfo*)info) ||
            !VarIs<RecyclableObject>(startingObject) ||
            UnsafeVarTo<RecyclableObject>(startingObject)->GetScriptContext() != requestContext)
        {
            // Don't need to cache if the beginning property is number etc.
            return;
        }

#ifdef TELEMETRY_AddToCache
        // For performance reasons, only execute this code in interpreted mode, not JIT.
        // This method only returns true in interpreted mode and can be used to detect interpreted mode.
        if (info->AllowResizingPolymorphicInlineCache())
        {
            if (TELEMETRY_PROPERTY_OPCODE_FILTER(propertyId))
            {
                requestContext->GetTelemetry().GetOpcodeTelemetry().GetProperty(objectWithProperty, propertyId, nullptr);
            }
        }
#endif

        Cache<false, true, true>(
            isProto,
            dynamicObjectWithProperty,
            isRoot,
            VarTo<RecyclableObject>(startingObject)->GetType(),
            nullptr,
            propertyId,
            slotIndex,
            isInlineSlot,
            isMissing,
            0,
            info,
            requestContext);
    }